

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::remove_mblur(SceneGraph *this,Ref<embree::SceneGraph::Node> *node,bool mblur)

{
  Node *pNVar1;
  long *plVar2;
  bool bVar3;
  long *plVar4;
  long lVar5;
  SceneGraph *pSVar6;
  ulong uVar7;
  long local_58;
  Ref<embree::SceneGraph::Node> local_50;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Node *local_38;
  
  pNVar1 = node->ptr;
  if (pNVar1 == (Node *)0x0) goto LAB_00152828;
  plVar4 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&TransformNode::typeinfo,0);
  if (plVar4 == (long *)0x0) {
    plVar4 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
    if (plVar4 == (long *)0x0) {
      plVar4 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&GroupNode::typeinfo,0);
      if (plVar4 == (long *)0x0) {
        plVar4 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
        if (plVar4 == (long *)0x0) {
          plVar4 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
          if (plVar4 == (long *)0x0) {
            plVar4 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&SubdivMeshNode::typeinfo,0);
            if (plVar4 == (long *)0x0) {
              plVar4 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&HairSetNode::typeinfo,0);
              if (plVar4 == (long *)0x0) {
                plVar4 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&PointSetNode::typeinfo,0);
                if (plVar4 != (long *)0x0) {
                  (**(code **)(*plVar4 + 0x10))(plVar4);
                  if ((ulong)(plVar4[0x10] - plVar4[0xf]) < 0x21 != mblur) {
                    *(undefined8 *)this = 0;
                    (**(code **)(*plVar4 + 0x18))(plVar4);
                    return (Ref<embree::SceneGraph::Node>)(Node *)this;
                  }
                  (**(code **)(*plVar4 + 0x18))(plVar4);
                }
              }
              else {
                (**(code **)(*plVar4 + 0x10))(plVar4);
                if ((ulong)(plVar4[0x10] - plVar4[0xf]) < 0x21 != mblur) {
                  *(undefined8 *)this = 0;
                  (**(code **)(*plVar4 + 0x18))(plVar4);
                  return (Ref<embree::SceneGraph::Node>)(Node *)this;
                }
                (**(code **)(*plVar4 + 0x18))(plVar4);
              }
            }
            else {
              (**(code **)(*plVar4 + 0x10))(plVar4);
              if ((ulong)(plVar4[0xf] - plVar4[0xe]) < 0x21 != mblur) {
                *(undefined8 *)this = 0;
                (**(code **)(*plVar4 + 0x18))(plVar4);
                return (Ref<embree::SceneGraph::Node>)(Node *)this;
              }
              (**(code **)(*plVar4 + 0x18))(plVar4);
            }
          }
          else {
            (**(code **)(*plVar4 + 0x10))(plVar4);
            if ((ulong)(plVar4[0xf] - plVar4[0xe]) < 0x21 != mblur) {
              *(undefined8 *)this = 0;
              (**(code **)(*plVar4 + 0x18))(plVar4);
              return (Ref<embree::SceneGraph::Node>)(Node *)this;
            }
            (**(code **)(*plVar4 + 0x18))(plVar4);
          }
        }
        else {
          (**(code **)(*plVar4 + 0x10))(plVar4);
          if ((ulong)(plVar4[0xf] - plVar4[0xe]) < 0x21 != mblur) {
            *(undefined8 *)this = 0;
            (**(code **)(*plVar4 + 0x18))(plVar4);
            return (Ref<embree::SceneGraph::Node>)(Node *)this;
          }
          (**(code **)(*plVar4 + 0x18))(plVar4);
        }
      }
      else {
        local_38 = (Node *)this;
        (**(code **)(*plVar4 + 0x10))(plVar4);
        lVar5 = plVar4[0xd];
        if (plVar4[0xe] != lVar5) {
          uVar7 = 0;
          do {
            local_50.ptr = *(Node **)(lVar5 + uVar7 * 8);
            if (local_50.ptr != (Node *)0x0) {
              (*((local_50.ptr)->super_RefCount)._vptr_RefCount[2])();
            }
            remove_mblur((SceneGraph *)&local_58,&local_50,mblur);
            lVar5 = plVar4[0xd];
            plVar2 = *(long **)(lVar5 + uVar7 * 8);
            if (plVar2 != (long *)0x0) {
              (**(code **)(*plVar2 + 0x18))();
            }
            *(long *)(lVar5 + uVar7 * 8) = local_58;
            if (local_50.ptr != (Node *)0x0) {
              (*((local_50.ptr)->super_RefCount)._vptr_RefCount[3])();
            }
            uVar7 = uVar7 + 1;
            lVar5 = plVar4[0xd];
          } while (uVar7 < (ulong)(plVar4[0xe] - lVar5 >> 3));
        }
        (**(code **)(*plVar4 + 0x18))(plVar4);
        this = (SceneGraph *)local_38;
      }
    }
    else {
      (**(code **)(*plVar4 + 0x10))(plVar4);
      lVar5 = plVar4[0xd];
      if (mblur) {
        pSVar6 = this;
        if ((plVar4[0xe] == lVar5) || (1 < *(ulong *)(lVar5 + 0x10))) {
LAB_001527b8:
          *(Node **)pSVar6 = (Node *)0x0;
          (**(code **)(*plVar4 + 0x18))(plVar4);
          return (Ref<embree::SceneGraph::Node>)(Node *)this;
        }
      }
      else if ((plVar4[0xe] != lVar5) && (1 < *(ulong *)(lVar5 + 0x10))) {
        *(Node **)this = node->ptr;
        pSVar6 = (SceneGraph *)node;
        goto LAB_001527b8;
      }
      local_48.ptr = (Node *)plVar4[0x10];
      if (local_48.ptr != (Node *)0x0) {
        (*((local_48.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      remove_mblur((SceneGraph *)&local_58,&local_48,mblur);
      if ((long *)plVar4[0x10] != (long *)0x0) {
        (**(code **)(*(long *)plVar4[0x10] + 0x18))();
      }
      plVar4[0x10] = local_58;
      if (local_48.ptr != (Node *)0x0) {
        (*((local_48.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      (**(code **)(*plVar4 + 0x18))(plVar4);
    }
    goto LAB_00152828;
  }
  (**(code **)(*plVar4 + 0x10))(plVar4);
  if (mblur) {
    if (1 < (ulong)plVar4[0xf]) {
      *(undefined8 *)this = 0;
      goto LAB_00152674;
    }
LAB_00152678:
    local_40.ptr = (Node *)plVar4[0x13];
    if (local_40.ptr != (Node *)0x0) {
      (*((local_40.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    remove_mblur((SceneGraph *)&local_58,&local_40,mblur);
    if ((long *)plVar4[0x13] != (long *)0x0) {
      (**(code **)(*(long *)plVar4[0x13] + 0x18))();
    }
    plVar4[0x13] = local_58;
    if (local_40.ptr != (Node *)0x0) {
      (*((local_40.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    bVar3 = true;
  }
  else {
    if ((ulong)plVar4[0xf] < 2) goto LAB_00152678;
    *(Node **)this = node->ptr;
    node->ptr = (Node *)0x0;
LAB_00152674:
    bVar3 = false;
  }
  (**(code **)(*plVar4 + 0x18))(plVar4);
  if (!bVar3) {
    return (Ref<embree::SceneGraph::Node>)(Node *)this;
  }
LAB_00152828:
  (((Node *)this)->super_RefCount)._vptr_RefCount = (_func_int **)node->ptr;
  node->ptr = (Node *)0x0;
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::remove_mblur(Ref<SceneGraph::Node> node, bool mblur)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      if (mblur) {
        if (xfmNode->spaces.size() > 1)
          return nullptr;
      } else {
        if (xfmNode->spaces.size() > 1)
          return node;
      }
      xfmNode->child = remove_mblur(xfmNode->child, mblur);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      if (mblur) {
        if (xfmNode->spaces.size() == 0 || xfmNode->spaces[0].size() > 1)
          return nullptr;
      } else {
        if (xfmNode->spaces.size() > 0 && xfmNode->spaces[0].size() > 1)
          return node;
      }
      xfmNode->child = remove_mblur(xfmNode->child, mblur);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>())
    {
      for (size_t i=0; i<groupNode->children.size(); i++)
        groupNode->children[i] = remove_mblur(groupNode->children[i], mblur);
    }
    else if (Ref<SceneGraph::TriangleMeshNode> mesh = node.dynamicCast<SceneGraph::TriangleMeshNode>())
    {
      if ((mesh->numTimeSteps() > 1) == mblur)
        return nullptr;
    }
    else if (Ref<SceneGraph::QuadMeshNode> mesh = node.dynamicCast<SceneGraph::QuadMeshNode>())
    {
      if ((mesh->numTimeSteps() > 1) == mblur)
        return nullptr;
    }
    else if (Ref<SceneGraph::SubdivMeshNode> mesh = node.dynamicCast<SceneGraph::SubdivMeshNode>())
    {
      if ((mesh->numTimeSteps() > 1) == mblur)
        return nullptr;
    }
    else if (Ref<SceneGraph::HairSetNode> mesh = node.dynamicCast<SceneGraph::HairSetNode>())
    {
      if ((mesh->numTimeSteps() > 1) == mblur)
        return nullptr;
    }
    else if (Ref<SceneGraph::PointSetNode> mesh = node.dynamicCast<SceneGraph::PointSetNode>())
    {
      if ((mesh->numTimeSteps() > 1) == mblur)
        return nullptr;
    }
    return node;
  }